

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

Matrix * GetCameraViewMatrix(Matrix *__return_storage_ptr__,Camera *camera)

{
  MatrixLookAt(__return_storage_ptr__,camera->position,camera->target,camera->up);
  return __return_storage_ptr__;
}

Assistant:

Matrix GetCameraViewMatrix(Camera *camera)
{
    return MatrixLookAt(camera->position, camera->target, camera->up);
}